

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O3

int little2_cdataSectionTok(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  long lVar4;
  byte *pbVar5;
  byte *pbVar6;
  ulong uVar7;
  bool bVar8;
  
  if (ptr == end) {
    return -4;
  }
  uVar7 = (long)end - (long)ptr & 0xfffffffffffffffe;
  pbVar6 = (byte *)(ptr + uVar7);
  if (uVar7 == 0) {
    pbVar6 = (byte *)end;
  }
  bVar8 = ((long)end - (long)ptr & 1U) != 0;
  if (!bVar8) {
    pbVar6 = (byte *)end;
  }
  if (bVar8 && uVar7 == 0) {
    return -1;
  }
  bVar1 = ptr[1];
  iVar2 = 0;
  pbVar5 = (byte *)ptr;
  if (0xdb < bVar1) {
    if ((bVar1 - 0xdc < 4) || ((bVar1 == 0xff && (0xfd < (byte)*ptr))))
    goto switchD_00159134_caseD_0;
    goto switchD_00159134_caseD_2;
  }
  if (bVar1 - 0xd8 < 4) {
switchD_00159134_caseD_7:
    if ((long)pbVar6 - (long)ptr < 4) {
      return -2;
    }
    pbVar3 = (byte *)(ptr + 4);
    goto LAB_00159192;
  }
  if (bVar1 != 0) goto switchD_00159134_caseD_2;
  iVar2 = 0;
  switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*ptr)) {
  case 0:
  case 1:
  case 8:
    goto switchD_00159134_caseD_0;
  case 4:
    pbVar3 = (byte *)(ptr + 2);
    if (pbVar3 == pbVar6) {
      return -1;
    }
    if ((ptr[3] == '\0') && (*pbVar3 == 0x5d)) {
      if ((byte *)(ptr + 4) == pbVar6) {
        return -1;
      }
      if ((ptr[5] == '\0') && (ptr[4] == 0x3e)) {
        iVar2 = 0x28;
        pbVar5 = (byte *)(ptr + 6);
        goto switchD_00159134_caseD_0;
      }
    }
    break;
  case 5:
    if ((long)pbVar6 - (long)ptr < 2) {
      return -2;
    }
  default:
switchD_00159134_caseD_2:
    pbVar3 = (byte *)(ptr + 2);
    break;
  case 6:
    if ((long)pbVar6 - (long)ptr < 3) {
      return -2;
    }
    pbVar3 = (byte *)(ptr + 3);
    break;
  case 7:
    goto switchD_00159134_caseD_7;
  case 9:
    pbVar3 = (byte *)(ptr + 2);
    if (pbVar3 == pbVar6) {
      return -1;
    }
    iVar2 = 7;
    if (ptr[3] == '\0') {
      pbVar5 = (byte *)(ptr + 4);
      if (*(char *)((long)enc[1].scanners + (ulong)(byte)ptr[2]) != '\n') {
        pbVar5 = pbVar3;
      }
      goto switchD_00159134_caseD_0;
    }
    goto switchD_0015921c_caseD_0;
  case 10:
    iVar2 = 7;
    pbVar5 = (byte *)(ptr + 2);
    goto switchD_00159134_caseD_0;
  }
LAB_00159192:
  iVar2 = 6;
  for (; pbVar3 != pbVar6; pbVar3 = pbVar3 + lVar4) {
    bVar1 = pbVar3[1];
    lVar4 = 2;
    if (bVar1 < 0xdc) {
      if (bVar1 - 0xd8 < 4) {
switchD_0015921c_caseD_7:
        lVar4 = 4;
        if ((long)pbVar6 - (long)pbVar3 < 4) break;
      }
      else if (bVar1 == 0) {
        switch(*(undefined1 *)((long)enc[1].scanners + (ulong)*pbVar3)) {
        case 0:
        case 1:
        case 4:
        case 8:
        case 9:
        case 10:
          goto switchD_0015921c_caseD_0;
        case 5:
          if ((long)pbVar6 - (long)pbVar3 < 2) goto switchD_0015921c_caseD_0;
          break;
        case 6:
          lVar4 = 3;
          if ((long)pbVar6 - (long)pbVar3 < 3) goto switchD_0015921c_caseD_0;
          break;
        case 7:
          goto switchD_0015921c_caseD_7;
        }
      }
    }
    else if (bVar1 == 0xff) {
      if (0xfd < *pbVar3) break;
    }
    else if (bVar1 - 0xdc < 4) break;
  }
switchD_0015921c_caseD_0:
  pbVar5 = pbVar3;
switchD_00159134_caseD_0:
  *nextTokPtr = (char *)pbVar5;
  return iVar2;
}

Assistant:

static
int PREFIX(cdataSectionTok)(const ENCODING *enc, const char *ptr, const char *end,
                            const char **nextTokPtr)
{
  if (ptr == end)
    return XML_TOK_NONE;
  if (MINBPC(enc) > 1) {
    size_t n = end - ptr;
    if (n & (MINBPC(enc) - 1)) {
      n &= ~(MINBPC(enc) - 1);
      if (n == 0)
        return XML_TOK_PARTIAL;
      end = ptr + n;
    }
  }
  switch (BYTE_TYPE(enc, ptr)) {
  case BT_RSQB:
    ptr += MINBPC(enc);
    if (ptr == end)
      return XML_TOK_PARTIAL;
    if (!CHAR_MATCHES(enc, ptr, ASCII_RSQB))
      break;
    ptr += MINBPC(enc);
    if (ptr == end)
      return XML_TOK_PARTIAL;
    if (!CHAR_MATCHES(enc, ptr, ASCII_GT)) {
      ptr -= MINBPC(enc);
      break;
    }
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_CDATA_SECT_CLOSE;
  case BT_CR:
    ptr += MINBPC(enc);
    if (ptr == end)
      return XML_TOK_PARTIAL;
    if (BYTE_TYPE(enc, ptr) == BT_LF)
      ptr += MINBPC(enc);
    *nextTokPtr = ptr;
    return XML_TOK_DATA_NEWLINE;
  case BT_LF:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_DATA_NEWLINE;
  INVALID_CASES(ptr, nextTokPtr)
  default:
    ptr += MINBPC(enc);
    break;
  }
  while (ptr != end) {
    switch (BYTE_TYPE(enc, ptr)) {
#define LEAD_CASE(n) \
    case BT_LEAD ## n: \
      if (end - ptr < n || IS_INVALID_CHAR(enc, ptr, n)) { \
        *nextTokPtr = ptr; \
        return XML_TOK_DATA_CHARS; \
      } \
      ptr += n; \
      break;
    LEAD_CASE(2) LEAD_CASE(3) LEAD_CASE(4)
#undef LEAD_CASE
    case BT_NONXML:
    case BT_MALFORM:
    case BT_TRAIL:
    case BT_CR:
    case BT_LF:
    case BT_RSQB:
      *nextTokPtr = ptr;
      return XML_TOK_DATA_CHARS;
    default:
      ptr += MINBPC(enc);
      break;
    }
  }
  *nextTokPtr = ptr;
  return XML_TOK_DATA_CHARS;
}